

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.h
# Opt level: O0

void __thiscall FsmTable::~FsmTable(FsmTable *this)

{
  bool bVar1;
  iterator this_00;
  reference ppFVar2;
  FsmState *in_RDI;
  FsmState **pfstate;
  iterator __end1;
  iterator __begin1;
  vector<FsmState_*,_std::allocator<FsmState_*>_> *__range1;
  FsmState *in_stack_ffffffffffffffc8;
  __normal_iterator<FsmState_**,_std::vector<FsmState_*,_std::allocator<FsmState_*>_>_> local_18;
  set<int,_std::less<int>,_std::allocator<int>_> *local_10;
  
  local_10 = &in_RDI->m_setiruleMatched;
  local_18._M_current =
       (FsmState **)
       std::vector<FsmState_*,_std::allocator<FsmState_*>_>::begin
                 ((vector<FsmState_*,_std::allocator<FsmState_*>_> *)in_stack_ffffffffffffffc8);
  this_00 = std::vector<FsmState_*,_std::allocator<FsmState_*>_>::end
                      ((vector<FsmState_*,_std::allocator<FsmState_*>_> *)in_stack_ffffffffffffffc8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<FsmState_**,_std::vector<FsmState_*,_std::allocator<FsmState_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<FsmState_**,_std::vector<FsmState_*,_std::allocator<FsmState_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<FsmState_**,_std::vector<FsmState_*,_std::allocator<FsmState_*>_>_>
              ::operator*(&local_18);
    in_stack_ffffffffffffffc8 = *ppFVar2;
    if (in_stack_ffffffffffffffc8 != (FsmState *)0x0) {
      FsmState::~FsmState(in_RDI);
      operator_delete(in_stack_ffffffffffffffc8,0x90);
    }
    __gnu_cxx::__normal_iterator<FsmState_**,_std::vector<FsmState_*,_std::allocator<FsmState_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<FsmState_*,_std::allocator<FsmState_*>_>::~vector
            ((vector<FsmState_*,_std::allocator<FsmState_*>_> *)this_00._M_current);
  return;
}

Assistant:

~FsmTable()
	{
		for (auto && pfstate: m_vpfstate)
			delete pfstate;
	}